

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panel_code.cpp
# Opt level: O1

int panel_item_width_proc(Am_Object *self)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Value fw;
  Am_Object owner;
  Am_Value local_30;
  Am_Object local_20;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    local_30.type = 0;
    local_30.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar4 = Am_Object::Get(&local_20,0x99,1);
    Am_Value::operator=(&local_30,pAVar4);
    if (local_30.type == 2) {
      iVar3 = Am_Value::operator_cast_to_int(&local_30);
      if (iVar3 == 1) {
        AVar2 = 0x6e;
        self = &local_20;
      }
      else if (iVar3 == 0) {
        AVar2 = 0x1d0;
      }
      else {
        AVar2 = 0x99;
      }
      pAVar4 = Am_Object::Get(self,AVar2,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    }
    else if (local_30.type == 4) {
      bVar1 = Am_Value::operator_cast_to_bool(&local_30);
      if (bVar1) {
        self = &local_20;
      }
      AVar2 = 0x1d0;
      if (bVar1) {
        AVar2 = 0x6e;
      }
      pAVar4 = Am_Object::Get(self,AVar2,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    }
    else {
      iVar3 = 0;
      Am_Error("Am_Panel_Item_Width: wrong type for Am_FIXED_WIDTH slot.",self,0x99);
    }
    Am_Value::~Am_Value(&local_30);
  }
  else {
    pAVar4 = Am_Object::Get(self,0x1d0,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  }
  Am_Object::~Am_Object(&local_20);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, panel_item_width)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Am_Value fw;
    fw = owner.Peek(Am_FIXED_WIDTH);
    if (fw.type == Am_BOOL) {
      if ((bool)fw)
        return owner.Get(Am_MAX_WIDTH);
      else
        return self.Get(Am_REAL_WIDTH);
    } else // not Am_BOOL
        if (fw.type == Am_INT) {
      int n = fw;
      if (n == 0)
        return self.Get(Am_REAL_WIDTH);
      if (n == 1)
        return owner.Get(Am_MAX_WIDTH);
      return self.Get(Am_FIXED_WIDTH);
    }
    //    else if (!fw.Exists())
    //  return 0;
    else { // neither int nor bool: error.
      Am_Error("Am_Panel_Item_Width: wrong type for Am_FIXED_WIDTH slot.", self,
               Am_FIXED_WIDTH);
      return 0;
    }
  } else
    return self.Get(Am_REAL_WIDTH);
}